

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readpsm.c
# Opt level: O2

int pattcmp(uchar *a,uchar *b,size_t l)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  char *p;
  ulong local_38;
  
  iVar1 = bcmp(a,b,l);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    uVar4 = 0;
    for (sVar5 = 0; sVar6 = l, l != sVar5; sVar5 = sVar5 + 1) {
      if ((byte)(a[sVar5] - 0x30) < 10) {
        uVar4 = strtoul((char *)(a + sVar5),&p,10);
        sVar6 = sVar5;
        if (a + sVar5 == (uchar *)p) {
          return 1;
        }
        break;
      }
    }
    iVar2 = 0;
    for (sVar5 = 0; l != sVar5; sVar5 = sVar5 + 1) {
      if ((byte)(b[sVar5] - 0x30) < 10) {
        local_38 = uVar4;
        uVar4 = strtoul((char *)(b + sVar5),&p,10);
        iVar2 = (int)uVar4;
        uVar4 = local_38;
        l = sVar5;
        if (b + sVar5 == (uchar *)p) {
          return -1;
        }
        break;
      }
    }
    iVar1 = -1;
    if (l <= sVar6) {
      iVar3 = memcmp(a,b,l);
      iVar1 = (int)uVar4 - iVar2;
      if (iVar3 != 0) {
        iVar1 = iVar3;
      }
    }
  }
  return iVar1;
}

Assistant:

int pattcmp( const unsigned char * a, const unsigned char * b, size_t l )
{
	size_t i, j;
	int na = 0, nb = 0, k;
	char * p;

	k = memcmp( a, b, l );
	if ( !k ) return k;

	/* damnit */

	for ( i = 0; i < l; ++i )
	{
		if ( a [i] >= '0' && a [i] <= '9' ) break;
	}

	if ( i < l )
	{
		na = strtoul( (const char *)a + i, &p, 10 );
		if ( p == (const char *)a + i ) return 1;
	}

	for ( j = 0; j < l; ++j )
	{
		if ( b [j] >= '0' && b [j] <= '9' ) break;
	}

	if ( j < l )
	{
		nb = strtoul( (const char *)b + j, &p, 10 );
		if ( p == (const char *)b + j ) return -1;
	}

	if ( i < j ) return -1;
	else if ( j > i ) return 1;

	k = memcmp( a, b, j );
	if ( k ) return k;

	return na - nb;
}